

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O0

void Abc_SclWireLoadSelFree(SC_WireLoadSel *p)

{
  SC_WireLoadSel *p_local;
  
  Vec_FltErase(&p->vAreaFrom);
  Vec_FltErase(&p->vAreaTo);
  Vec_PtrFreeData(&p->vWireLoadModel);
  Vec_PtrErase(&p->vWireLoadModel);
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p != (SC_WireLoadSel *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static inline void Abc_SclWireLoadSelFree( SC_WireLoadSel * p )
{
    Vec_FltErase( &p->vAreaFrom );
    Vec_FltErase( &p->vAreaTo );
    Vec_PtrFreeData( &p->vWireLoadModel );
    Vec_PtrErase( &p->vWireLoadModel );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}